

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::fromFirst(String *this,String *find,bool includeFind)

{
  int iVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  String SVar3;
  undefined4 local_44;
  int pos;
  bool includeFind_local;
  String *find_local;
  String *this_local;
  uchar *puVar2;
  
  local_44 = Find(find,(String *)CONCAT71(in_register_00000011,includeFind),0);
  if (local_44 == -1) {
    if ((in_CL & 1) == 0) {
      String(this);
      puVar2 = extraout_RDX_00;
    }
    else {
      String(this,find);
      puVar2 = extraout_RDX;
    }
  }
  else {
    if ((in_CL & 1) == 0) {
      iVar1 = getLength((String *)CONCAT71(in_register_00000011,includeFind));
      local_44 = local_44 + iVar1;
    }
    SVar3 = midString(this,(int)find,local_44);
    puVar2 = SVar3.super_tagbstring.data;
  }
  SVar3.super_tagbstring.data = puVar2;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

const String String::fromFirst(const String & find, const bool includeFind) const
    {
        int pos = Find(find, 0);
        if (pos == -1) return includeFind ? *this : String();
        return midString(includeFind ? pos : pos + find.getLength(), slen);
    }